

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::removeWaiter(Mutex *this,Waiter *waiter)

{
  bool bVar1;
  Waiter *pWVar2;
  Fault local_68;
  Fault f;
  Maybe<kj::_::Mutex::Waiter_&> **local_58;
  undefined1 local_50 [8];
  DebugComparison<kj::Maybe<kj::_::Mutex::Waiter_&>_*&,_kj::Maybe<kj::_::Mutex::Waiter_&>_*>
  _kjCondition;
  Waiter *next;
  Waiter *_next106;
  Waiter *waiter_local;
  Mutex *this_local;
  
  assertLockedByCaller(this,EXCLUSIVE);
  Maybe<kj::_::Mutex::Waiter_&>::operator=(waiter->prev,&waiter->next);
  pWVar2 = readMaybe<kj::_::Mutex::Waiter>(&waiter->next);
  if (pWVar2 == (Waiter *)0x0) {
    local_58 = (Maybe<kj::_::Mutex::Waiter_&> **)
               DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->waitersTail);
    f.exception = (Exception *)waiter;
    DebugExpression<kj::Maybe<kj::_::Mutex::Waiter&>*&>::operator==
              ((DebugComparison<kj::Maybe<kj::_::Mutex::Waiter_&>_*&,_kj::Maybe<kj::_::Mutex::Waiter_&>_*>
                *)local_50,(DebugExpression<kj::Maybe<kj::_::Mutex::Waiter&>*&> *)&local_58,
               (Maybe<kj::_::Mutex::Waiter_&> **)&f);
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::Mutex::Waiter&>*&,kj::Maybe<kj::_::Mutex::Waiter&>*>&>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                 ,0x6d,FAILED,"waitersTail == &waiter.next","_kjCondition,",
                 (DebugComparison<kj::Maybe<kj::_::Mutex::Waiter_&>_*&,_kj::Maybe<kj::_::Mutex::Waiter_&>_*>
                  *)local_50);
      Debug::Fault::fatal(&local_68);
    }
    this->waitersTail = waiter->prev;
  }
  else {
    pWVar2->prev = waiter->prev;
  }
  return;
}

Assistant:

inline void Mutex::removeWaiter(Waiter& waiter) {
#ifdef KJ_DEBUG
  assertLockedByCaller(EXCLUSIVE);
#endif
  *waiter.prev = waiter.next;
  KJ_IF_SOME(next, waiter.next) {
    next.prev = waiter.prev;
  } else {
    KJ_DASSERT(waitersTail == &waiter.next);
    waitersTail = waiter.prev;
  }